

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glApi.hpp
# Opt level: O3

void __thiscall
Program::setUniform<glm::mat<4,4,float,(glm::qualifier)0>>
          (Program *this,string *name,mat<4,_4,_float,_(glm::qualifier)0> *val)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  int location;
  int local_1c;
  
  bVar1 = getUniformLocation(this,name,&local_1c);
  if ((bVar1) && (bVar1 = bound(this), bVar1)) {
    uniformDispatcher<glm::mat<4,4,float,(glm::qualifier)0>>(local_1c,val);
    return;
  }
  bVar1 = bound(this);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"=====",5);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
    pcVar4 = " uniform was queried but does not exist\n";
    lVar3 = 0x28;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"===== Program is not attached (for uniform \'",0x2c);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(name->_M_dataplus)._M_p,name->_M_string_length);
    pcVar4 = "\')\n";
    lVar3 = 3;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  return;
}

Assistant:

void Program::setUniform(const std::string & name, const T & val) const
{
  int location;
  if (getUniformLocation(name, location) and bound()) {
    uniformDispatcher<T>(location, val);
  } else if (not bound()) {
    std::cerr << "===== Program is not attached (for uniform '" << name << "')\n";
  } else {
    std::cerr << "=====" << name << " uniform was queried but does not exist\n";
  }
}